

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalNinjaGenerator::InitOutputPathPrefix(cmGlobalNinjaGenerator *this)

{
  reference ppcVar1;
  cmMakefile *this_00;
  string *psVar2;
  allocator<char> local_31;
  string local_30;
  cmGlobalNinjaGenerator *local_10;
  cmGlobalNinjaGenerator *this_local;
  
  local_10 = this;
  ppcVar1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                        LocalGenerators,0);
  this_00 = cmLocalGenerator::GetMakefile(*ppcVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_NINJA_OUTPUT_PATH_PREFIX",&local_31);
  psVar2 = cmMakefile::GetSafeDefinition(this_00,&local_30);
  std::__cxx11::string::operator=((string *)&this->OutputPathPrefix,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  EnsureTrailingSlash(&this->OutputPathPrefix);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::InitOutputPathPrefix()
{
  this->OutputPathPrefix =
    this->LocalGenerators[0]->GetMakefile()->GetSafeDefinition(
      "CMAKE_NINJA_OUTPUT_PATH_PREFIX");
  EnsureTrailingSlash(this->OutputPathPrefix);
}